

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chunk_reader_suite.cpp
# Opt level: O0

void whitespace_suite::white_keyword(void)

{
  bool bVar1;
  undefined4 local_21c;
  value local_218 [2];
  basic_string_view<char,_std::char_traits<char>_> local_210;
  undefined4 local_1fc;
  value local_1f8 [2];
  basic_string_view<char,_std::char_traits<char>_> local_1f0;
  undefined4 local_1dc;
  value local_1d8 [2];
  basic_string_view<char,_std::char_traits<char>_> local_1d0;
  undefined4 local_1bc;
  value local_1b8 [2];
  basic_string_view<char,_std::char_traits<char>_> local_1b0;
  undefined4 local_19c;
  value local_198 [2];
  basic_string_view<char,_std::char_traits<char>_> local_190;
  undefined4 local_180;
  value local_17c [5];
  basic_string_view<char,_std::char_traits<char>_> local_168;
  undefined1 local_158 [8];
  chunk_reader reader;
  char input [7];
  
  reader.super_basic_reader<char>.stack.c.
  super__Vector_base<trial::protocol::json::basic_reader<char>::frame,_std::allocator<trial::protocol::json::basic_reader<char>::frame>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._4_3_ = 0x6c6c;
  reader.super_basic_reader<char>.stack.c.
  super__Vector_base<trial::protocol::json::basic_reader<char>::frame,_std::allocator<trial::protocol::json::basic_reader<char>::frame>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ = 0x756e0a0a;
  trial::protocol::json::basic_chunk_reader<char>::basic_chunk_reader
            ((basic_chunk_reader<char> *)local_158);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_168,
             (char *)((long)&reader.super_basic_reader<char>.stack.c.
                             super__Vector_base<trial::protocol::json::basic_reader<char>::frame,_std::allocator<trial::protocol::json::basic_reader<char>::frame>_>
                             ._M_impl.super__Vector_impl_data + 0x10),1);
  bVar1 = trial::protocol::json::basic_chunk_reader<char>::next
                    ((basic_chunk_reader<char> *)local_158,&local_168);
  boost::detail::test_impl
            ("!reader.next(json::chunk_reader::view_type(input, 1))",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/chunk_reader_suite.cpp"
             ,0xbd,"void whitespace_suite::white_keyword()",(bool)(~bVar1 & 1));
  local_17c[0] = trial::protocol::json::basic_reader<char>::code((basic_reader<char> *)local_158);
  local_180 = 1;
  boost::detail::
  test_with_impl<boost::detail::lw_test_eq,trial::protocol::json::token::code::value,trial::protocol::json::token::code::value>
            ("reader.code()","token::code::uninitialized",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/chunk_reader_suite.cpp"
             ,0xbe,"void whitespace_suite::white_keyword()",local_17c,&local_180);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_190,
             (char *)((long)&reader.super_basic_reader<char>.stack.c.
                             super__Vector_base<trial::protocol::json::basic_reader<char>::frame,_std::allocator<trial::protocol::json::basic_reader<char>::frame>_>
                             ._M_impl.super__Vector_impl_data + 0x10),2);
  bVar1 = trial::protocol::json::basic_chunk_reader<char>::next
                    ((basic_chunk_reader<char> *)local_158,&local_190);
  boost::detail::test_impl
            ("!reader.next(json::chunk_reader::view_type(input, 2))",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/chunk_reader_suite.cpp"
             ,0xbf,"void whitespace_suite::white_keyword()",(bool)(~bVar1 & 1));
  local_198[0] = trial::protocol::json::basic_reader<char>::code((basic_reader<char> *)local_158);
  local_19c = 1;
  boost::detail::
  test_with_impl<boost::detail::lw_test_eq,trial::protocol::json::token::code::value,trial::protocol::json::token::code::value>
            ("reader.code()","token::code::uninitialized",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/chunk_reader_suite.cpp"
             ,0xc0,"void whitespace_suite::white_keyword()",local_198,&local_19c);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_1b0,
             (char *)((long)&reader.super_basic_reader<char>.stack.c.
                             super__Vector_base<trial::protocol::json::basic_reader<char>::frame,_std::allocator<trial::protocol::json::basic_reader<char>::frame>_>
                             ._M_impl.super__Vector_impl_data + 0x10),3);
  bVar1 = trial::protocol::json::basic_chunk_reader<char>::next
                    ((basic_chunk_reader<char> *)local_158,&local_1b0);
  boost::detail::test_impl
            ("!reader.next(json::chunk_reader::view_type(input, 3))",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/chunk_reader_suite.cpp"
             ,0xc1,"void whitespace_suite::white_keyword()",(bool)(~bVar1 & 1));
  local_1b8[0] = trial::protocol::json::basic_reader<char>::code((basic_reader<char> *)local_158);
  local_1bc = 1;
  boost::detail::
  test_with_impl<boost::detail::lw_test_eq,trial::protocol::json::token::code::value,trial::protocol::json::token::code::value>
            ("reader.code()","token::code::uninitialized",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/chunk_reader_suite.cpp"
             ,0xc2,"void whitespace_suite::white_keyword()",local_1b8,&local_1bc);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_1d0,
             (char *)((long)&reader.super_basic_reader<char>.stack.c.
                             super__Vector_base<trial::protocol::json::basic_reader<char>::frame,_std::allocator<trial::protocol::json::basic_reader<char>::frame>_>
                             ._M_impl.super__Vector_impl_data + 0x10),4);
  bVar1 = trial::protocol::json::basic_chunk_reader<char>::next
                    ((basic_chunk_reader<char> *)local_158,&local_1d0);
  boost::detail::test_impl
            ("!reader.next(json::chunk_reader::view_type(input, 4))",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/chunk_reader_suite.cpp"
             ,0xc3,"void whitespace_suite::white_keyword()",(bool)(~bVar1 & 1));
  local_1d8[0] = trial::protocol::json::basic_reader<char>::code((basic_reader<char> *)local_158);
  local_1dc = 1;
  boost::detail::
  test_with_impl<boost::detail::lw_test_eq,trial::protocol::json::token::code::value,trial::protocol::json::token::code::value>
            ("reader.code()","token::code::uninitialized",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/chunk_reader_suite.cpp"
             ,0xc4,"void whitespace_suite::white_keyword()",local_1d8,&local_1dc);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_1f0,
             (char *)((long)&reader.super_basic_reader<char>.stack.c.
                             super__Vector_base<trial::protocol::json::basic_reader<char>::frame,_std::allocator<trial::protocol::json::basic_reader<char>::frame>_>
                             ._M_impl.super__Vector_impl_data + 0x10),5);
  bVar1 = trial::protocol::json::basic_chunk_reader<char>::next
                    ((basic_chunk_reader<char> *)local_158,&local_1f0);
  boost::detail::test_impl
            ("!reader.next(json::chunk_reader::view_type(input, 5))",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/chunk_reader_suite.cpp"
             ,0xc5,"void whitespace_suite::white_keyword()",(bool)(~bVar1 & 1));
  local_1f8[0] = trial::protocol::json::basic_reader<char>::code((basic_reader<char> *)local_158);
  local_1fc = 1;
  boost::detail::
  test_with_impl<boost::detail::lw_test_eq,trial::protocol::json::token::code::value,trial::protocol::json::token::code::value>
            ("reader.code()","token::code::uninitialized",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/chunk_reader_suite.cpp"
             ,0xc6,"void whitespace_suite::white_keyword()",local_1f8,&local_1fc);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_210,
             (char *)((long)&reader.super_basic_reader<char>.stack.c.
                             super__Vector_base<trial::protocol::json::basic_reader<char>::frame,_std::allocator<trial::protocol::json::basic_reader<char>::frame>_>
                             ._M_impl.super__Vector_impl_data + 0x10),6);
  bVar1 = trial::protocol::json::basic_chunk_reader<char>::next
                    ((basic_chunk_reader<char> *)local_158,&local_210);
  boost::detail::test_impl
            ("reader.next(json::chunk_reader::view_type(input, 6))",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/chunk_reader_suite.cpp"
             ,199,"void whitespace_suite::white_keyword()",bVar1);
  local_218[0] = trial::protocol::json::basic_reader<char>::code((basic_reader<char> *)local_158);
  local_21c = 5;
  boost::detail::
  test_with_impl<boost::detail::lw_test_eq,trial::protocol::json::token::code::value,trial::protocol::json::token::code::value>
            ("reader.code()","token::code::null",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/chunk_reader_suite.cpp"
             ,200,"void whitespace_suite::white_keyword()",local_218,&local_21c);
  trial::protocol::json::basic_chunk_reader<char>::~basic_chunk_reader
            ((basic_chunk_reader<char> *)local_158);
  return;
}

Assistant:

void white_keyword()
{
    const char input[] = "\n\nnull";
    json::chunk_reader reader;
    TRIAL_PROTOCOL_TEST(!reader.next(json::chunk_reader::view_type(input, 1)));
    TRIAL_PROTOCOL_TEST_EQUAL(reader.code(), token::code::uninitialized);
    TRIAL_PROTOCOL_TEST(!reader.next(json::chunk_reader::view_type(input, 2)));
    TRIAL_PROTOCOL_TEST_EQUAL(reader.code(), token::code::uninitialized);
    TRIAL_PROTOCOL_TEST(!reader.next(json::chunk_reader::view_type(input, 3)));
    TRIAL_PROTOCOL_TEST_EQUAL(reader.code(), token::code::uninitialized);
    TRIAL_PROTOCOL_TEST(!reader.next(json::chunk_reader::view_type(input, 4)));
    TRIAL_PROTOCOL_TEST_EQUAL(reader.code(), token::code::uninitialized);
    TRIAL_PROTOCOL_TEST(!reader.next(json::chunk_reader::view_type(input, 5)));
    TRIAL_PROTOCOL_TEST_EQUAL(reader.code(), token::code::uninitialized);
    TRIAL_PROTOCOL_TEST(reader.next(json::chunk_reader::view_type(input, 6)));
    TRIAL_PROTOCOL_TEST_EQUAL(reader.code(), token::code::null);
}